

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

void absl::lts_20250127::anon_unknown_0::EncodeResult<float>
               (CalculatedFloat *calculated,bool negative,Nonnull<absl::from_chars_result_*> result,
               Nonnull<float_*> value)

{
  float fVar1;
  float fVar2;
  float local_2c;
  Nonnull<float_*> value_local;
  Nonnull<absl::from_chars_result_*> result_local;
  bool negative_local;
  CalculatedFloat *calculated_local;
  
  if (calculated->exponent == 99999) {
    result->ec = result_out_of_range;
    fVar1 = std::numeric_limits<float>::max();
    fVar2 = std::numeric_limits<float>::max();
    local_2c = -fVar1;
    if (!negative) {
      local_2c = fVar2;
    }
    *value = local_2c;
  }
  else if ((calculated->mantissa == 0) || (calculated->exponent == -99999)) {
    result->ec = result_out_of_range;
    fVar1 = -0.0;
    if (!negative) {
      fVar1 = 0.0;
    }
    *value = fVar1;
  }
  else {
    fVar1 = FloatTraits<float>::Make((mantissa_t)calculated->mantissa,calculated->exponent,negative)
    ;
    *value = fVar1;
  }
  return;
}

Assistant:

void EncodeResult(const CalculatedFloat& calculated, bool negative,
                  absl::Nonnull<absl::from_chars_result*> result,
                  absl::Nonnull<FloatType*> value) {
  if (calculated.exponent == kOverflow) {
    result->ec = std::errc::result_out_of_range;
    *value = negative ? -std::numeric_limits<FloatType>::max()
                      : std::numeric_limits<FloatType>::max();
    return;
  } else if (calculated.mantissa == 0 || calculated.exponent == kUnderflow) {
    result->ec = std::errc::result_out_of_range;
    *value = negative ? -0.0 : 0.0;
    return;
  }
  *value = FloatTraits<FloatType>::Make(
      static_cast<typename FloatTraits<FloatType>::mantissa_t>(
          calculated.mantissa),
      calculated.exponent, negative);
}